

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportBaseDirWrapper.cpp
# Opt level: O1

ImportBaseFuncWrapper * __thiscall
ImportBaseDirWrapper::thunkToFunction(ImportBaseDirWrapper *this,offset_t thunk)

{
  int iVar1;
  ImportBaseEntryWrapper *pIVar2;
  undefined4 extraout_var;
  ImportBaseFuncWrapper *pIVar3;
  _Rb_tree_header *p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  
  pIVar2 = thunkToLib(this,thunk);
  if (pIVar2 != (ImportBaseEntryWrapper *)0x0) {
    p_Var4 = &(pIVar2->thunkToFuncMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = (pIVar2->thunkToFuncMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var5 = &p_Var4->_M_header;
    for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[*(ulong *)(p_Var6 + 1) < thunk]) {
      if (*(ulong *)(p_Var6 + 1) >= thunk) {
        p_Var5 = p_Var6;
      }
    }
    p_Var6 = &p_Var4->_M_header;
    if (((_Rb_tree_header *)p_Var5 != p_Var4) && (p_Var6 = p_Var5, thunk < *(ulong *)(p_Var5 + 1)))
    {
      p_Var6 = &p_Var4->_M_header;
    }
    if ((_Rb_tree_header *)p_Var6 != p_Var4) {
      iVar1 = (*(pIVar2->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
                super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x20])(pIVar2,p_Var6[1]._M_parent)
      ;
      if (CONCAT44(extraout_var,iVar1) != 0) {
        pIVar3 = (ImportBaseFuncWrapper *)
                 __dynamic_cast(CONCAT44(extraout_var,iVar1),&ExeNodeWrapper::typeinfo,
                                &ImportBaseFuncWrapper::typeinfo,0);
        return pIVar3;
      }
    }
  }
  return (ImportBaseFuncWrapper *)0x0;
}

Assistant:

ImportBaseFuncWrapper* ImportBaseDirWrapper::thunkToFunction(offset_t thunk)
{
    ImportBaseEntryWrapper* lib = thunkToLib(thunk);
    if (!lib) return NULL;

    std::map<offset_t, size_t>::iterator funcItr = lib->thunkToFuncMap.find(thunk);
    if (funcItr == lib->thunkToFuncMap.end()) return NULL;

    ImportBaseFuncWrapper* func = dynamic_cast<ImportBaseFuncWrapper*>(lib->getEntryAt(funcItr->second));
    return func;
}